

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int ExportRGB(WebPDecParams *p,int y_pos)

{
  WebPYUV444Converter p_Var1;
  long lVar2;
  int iVar3;
  int in_ESI;
  long *in_RDI;
  int num_lines_out;
  uint8_t *dst;
  WebPRGBABuffer *buf;
  WebPYUV444Converter convert;
  uint in_stack_ffffffffffffffd0;
  uint uVar4;
  int iVar5;
  uint8_t *local_28;
  
  p_Var1 = WebPYUV444Converters[*(uint *)*in_RDI];
  lVar2 = *in_RDI;
  local_28 = (uint8_t *)(*(long *)(lVar2 + 0x10) + (long)in_ESI * (long)*(int *)(lVar2 + 0x18));
  iVar5 = 0;
  while( true ) {
    iVar3 = WebPRescalerHasPendingOutput((WebPRescaler *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    uVar4 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (iVar3 != 0) {
      iVar3 = WebPRescalerHasPendingOutput
                        ((WebPRescaler *)
                         (CONCAT44(iVar5,in_stack_ffffffffffffffd0) & 0xffffffff00ffffff));
      uVar4 = CONCAT13(iVar3 != 0,(int3)uVar4);
    }
    in_stack_ffffffffffffffd0 = uVar4;
    if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    (*p_Var1)(*(uint8_t **)(in_RDI[6] + 0x48),*(uint8_t **)(in_RDI[7] + 0x48),
              *(uint8_t **)(in_RDI[8] + 0x48),local_28,*(int *)(in_RDI[6] + 0x34));
    local_28 = local_28 + *(int *)(lVar2 + 0x18);
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

static int ExportRGB(WebPDecParams* const p, int y_pos) {
  const WebPYUV444Converter convert =
      WebPYUV444Converters[p->output->colorspace];
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* dst = buf->rgba + (size_t)y_pos * buf->stride;
  int num_lines_out = 0;
  // For RGB rescaling, because of the YUV420, current scan position
  // U/V can be +1/-1 line from the Y one.  Hence the double test.
  while (WebPRescalerHasPendingOutput(p->scaler_y) &&
         WebPRescalerHasPendingOutput(p->scaler_u)) {
    assert(y_pos + num_lines_out < p->output->height);
    assert(p->scaler_u->y_accum == p->scaler_v->y_accum);
    WebPRescalerExportRow(p->scaler_y);
    WebPRescalerExportRow(p->scaler_u);
    WebPRescalerExportRow(p->scaler_v);
    convert(p->scaler_y->dst, p->scaler_u->dst, p->scaler_v->dst,
            dst, p->scaler_y->dst_width);
    dst += buf->stride;
    ++num_lines_out;
  }
  return num_lines_out;
}